

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O1

bool __thiscall Vector::erase(Vector *this,void *ptr,Value v)

{
  char cVar1;
  Type *pTVar2;
  reference_wrapper<const_Typelib::Type> rVar3;
  long lVar4;
  ulong uVar5;
  runtime_error *this_00;
  size_t idx;
  void *pvVar6;
  bool bVar7;
  Value VVar8;
  Value VVar9;
  
  pTVar2 = (Type *)Typelib::Indirect::getIndirection();
  cVar1 = Typelib::Type::operator!=(v.m_type.t_.t_,pTVar2);
  if (cVar1 != '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"type mismatch in vector insertion");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  rVar3.t_ = (Type *)Typelib::Indirect::getIndirection();
  lVar4 = Typelib::Type::getSize();
  uVar5 = (**(code **)(*(long *)this + 200))(this,ptr);
  bVar7 = uVar5 != 0;
  if (bVar7) {
    pvVar6 = *ptr;
    VVar8.m_type.t_ = rVar3.t_;
    VVar8.m_data = pvVar6;
    cVar1 = Typelib::compare(VVar8,v);
    if (cVar1 == '\0') {
      idx = 0;
      do {
        pvVar6 = (void *)((long)pvVar6 + lVar4);
        if (uVar5 - 1 == idx) {
          return false;
        }
        VVar9.m_type.t_ = rVar3.t_;
        VVar9.m_data = pvVar6;
        cVar1 = Typelib::compare(VVar9,v);
        idx = idx + 1;
      } while (cVar1 == '\0');
      bVar7 = idx < uVar5;
    }
    else {
      idx = 0;
    }
    erase(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)ptr,idx);
  }
  return bVar7;
}

Assistant:

bool Vector::erase(void* ptr, Value v) const
{
    if (v.getType() != getIndirection())
        throw std::runtime_error("type mismatch in vector insertion");

    std::vector<uint8_t>* vector_ptr =
        reinterpret_cast< std::vector<uint8_t>* >(ptr);
    Type const& element_t  = getIndirection();
    size_t   element_size  = element_t.getSize();
    size_t   element_count = getElementCount(vector_ptr);

    uint8_t* base_ptr = &(*vector_ptr)[0];

    for (size_t i = 0; i < element_count; ++i)
    {
        uint8_t* element_ptr = base_ptr + i * element_size;
        Value    element_v(element_ptr, element_t);
        if (Typelib::compare(element_v, v))
        {
            erase(vector_ptr, i);
            return true;
        }
    }
    return false;
}